

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginInternal.hpp
# Opt level: O3

long __thiscall DISTRHO::PluginExporter::getUniqueId(PluginExporter *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  if (this->fPlugin == (Plugin *)0x0) {
    lVar2 = 0;
    d_stderr2("assertion failure: \"%s\" in file %s, line %i","fPlugin != nullptr",
              "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/dpf/distrho/src/DistrhoPluginInternal.hpp"
              ,0x1d8);
  }
  else {
    iVar1 = (*this->fPlugin->_vptr_Plugin[9])();
    lVar2 = CONCAT44(extraout_var,iVar1);
  }
  return lVar2;
}

Assistant:

long getUniqueId() const noexcept
    {
        DISTRHO_SAFE_ASSERT_RETURN(fPlugin != nullptr, 0);

        return fPlugin->getUniqueId();
    }